

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

ReflectionPayload * __thiscall
google::protobuf::internal::MapFieldBase::PayloadSlow(MapFieldBase *this)

{
  bool bVar1;
  _func_void_MapFieldBaseForParse_ptr_bool *__p;
  ReflectionPayload *pRVar2;
  TaggedPtr __i;
  TaggedPtr new_p;
  ReflectionPayload *payload;
  Arena *arena;
  TaggedPtr local_18;
  TaggedPtr p;
  MapFieldBase *this_local;
  
  p = (TaggedPtr)this;
  local_18 = std::atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr>::load
                       ((atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr> *)this,
                        memory_order_acquire);
  bVar1 = MapFieldBaseForParse::IsPayload(local_18);
  __i = local_18;
  if (!bVar1) {
    __p = PayloadSlow()_const::$_0::operator_cast_to_function_pointer((__0 *)((long)&arena + 7));
    std::atomic<void_(*)(const_google::protobuf::internal::MapFieldBaseForParse_&,_bool)>::store
              ((atomic<void_(*)(const_google::protobuf::internal::MapFieldBaseForParse_&,_bool)> *)
               &MapFieldBaseForParse::sync_map_with_repeated,__p,memory_order_relaxed);
    payload = (ReflectionPayload *)ToArena(local_18);
    pRVar2 = Arena::
             Create<google::protobuf::internal::MapFieldBase::ReflectionPayload,google::protobuf::Arena*&>
                       ((Arena *)payload,(Arena **)&payload);
    __i = ToTaggedPtr(pRVar2);
    bVar1 = std::atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr>::
            compare_exchange_strong
                      ((atomic<google::protobuf::internal::MapFieldBaseForParse::TaggedPtr> *)this,
                       &local_18,__i,memory_order_acq_rel);
    if (((!bVar1) && (__i = local_18, payload == (ReflectionPayload *)0x0)) &&
       (pRVar2 != (ReflectionPayload *)0x0)) {
      ReflectionPayload::~ReflectionPayload(pRVar2);
      operator_delete(pRVar2,0x28);
      __i = local_18;
    }
  }
  local_18 = __i;
  pRVar2 = ToPayload(local_18);
  return pRVar2;
}

Assistant:

MapFieldBase::ReflectionPayload& MapFieldBase::PayloadSlow() const {
  auto p = payload_.load(std::memory_order_acquire);
  if (!IsPayload(p)) {
    // Inject the sync callback.
    sync_map_with_repeated.store(
        [](auto& map, bool is_mutable) {
          const auto& self = static_cast<const MapFieldBase&>(map);
          self.SyncMapWithRepeatedField();
          if (is_mutable) const_cast<MapFieldBase&>(self).SetMapDirty();
        },
        std::memory_order_relaxed);

    auto* arena = ToArena(p);
    auto* payload = Arena::Create<ReflectionPayload>(arena, arena);

    auto new_p = ToTaggedPtr(payload);
    if (payload_.compare_exchange_strong(p, new_p, std::memory_order_acq_rel)) {
      // We were able to store it.
      p = new_p;
    } else {
      // Someone beat us to it. Throw away the one we made. `p` already contains
      // the one we want.
      if (arena == nullptr) delete payload;
    }
  }
  return *ToPayload(p);
}